

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StrokeTests.cpp
# Opt level: O2

void __thiscall
agge::tests::PathStrokeTests::StrokerGeneratesSinglePointSequenceForOpenSegment
          (PathStrokeTests *this)

{
  undefined4 uVar1;
  int iVar2;
  point pVar3;
  allocator local_231;
  stroke s;
  undefined1 local_1d8 [32];
  int local_1b8;
  point local_1b4;
  point local_1a8;
  point local_19c;
  point local_190;
  point local_184;
  undefined1 local_178 [24];
  point local_160;
  point local_154;
  point local_148;
  point local_13c;
  point local_130;
  point local_124;
  undefined1 local_118 [24];
  point local_100;
  point local_f4;
  point local_e8;
  point local_dc;
  point local_d0;
  point local_c4;
  point local_b8;
  undefined8 local_ac;
  undefined4 local_a4;
  undefined8 local_a0;
  undefined4 local_98;
  undefined8 local_94;
  undefined4 local_8c;
  undefined8 local_88;
  undefined4 local_80;
  undefined8 local_7c;
  undefined4 local_74;
  undefined8 local_70;
  undefined4 local_68;
  undefined8 local_64;
  undefined4 local_5c;
  string local_58;
  LocationInfo local_38;
  
  stroke::stroke(&s);
  move_to<agge::stroke>(&s,0.0,0.0);
  uVar1 = 2;
  stroke::add_vertex(&s,0.0,1.0,2);
  this->amount_alive = this->amount_alive + 1;
  local_118._0_8_ = &PTR__counted_001d50e8;
  local_118._8_8_ = this;
  stroke::set_cap<agge::tests::(anonymous_namespace)::passthrough_cap>
            (&s,(passthrough_cap *)local_118);
  local_118._0_8_ = &PTR__counted_001d5138;
  local_118._8_8_ = this;
  stroke::set_join<agge::tests::(anonymous_namespace)::passthrough_join>
            (&s,(passthrough_join *)local_118);
  this->amount_alive = this->amount_alive - 1;
  stroke::width(&s,4.0);
  pVar3 = vertex<agge::stroke>(&s);
  local_118._0_8_ = pVar3._0_8_;
  local_118._8_4_ = pVar3.command;
  pVar3 = vertex<agge::stroke>(&s);
  local_118._12_4_ = pVar3.x;
  local_118._16_8_ = pVar3._4_8_;
  local_100 = vertex<agge::stroke>(&s);
  local_f4 = vertex<agge::stroke>(&s);
  local_e8 = vertex<agge::stroke>(&s);
  local_dc = vertex<agge::stroke>(&s);
  local_d0 = vertex<agge::stroke>(&s);
  local_c4 = vertex<agge::stroke>(&s);
  local_b8.x = 2.0;
  local_b8.y = 1.0;
  local_b8.command = 1;
  local_ac = 0;
  local_a0 = 0x3f80000000000000;
  local_94 = 0x3f80000040000000;
  local_88 = 0x3f80000000000000;
  local_7c = 0;
  local_70 = 0;
  local_68 = 0x30;
  local_64 = 0;
  local_5c = 0;
  local_a4 = uVar1;
  local_98 = uVar1;
  local_8c = uVar1;
  local_80 = uVar1;
  local_74 = uVar1;
  std::__cxx11::string::string
            ((string *)local_1d8,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/StrokeTests.cpp"
             ,(allocator *)&local_38);
  ut::LocationInfo::LocationInfo((LocationInfo *)local_178,(string *)local_1d8,0xf3);
  ut::are_equal<agge::tests::mocks::path::point,agge::tests::mocks::path::point,8ul>
            ((point (*) [8])&local_b8,(point (*) [8])local_118,(LocationInfo *)local_178);
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  stroke::remove_all(&s);
  stroke::width(&s,3.0);
  move_to<agge::stroke>(&s,1.0,2.0);
  iVar2 = 2;
  stroke::add_vertex(&s,4.0,6.0,2);
  local_178._0_12_ = (undefined1  [12])vertex<agge::stroke>(&s);
  local_178._12_12_ = (undefined1  [12])vertex<agge::stroke>(&s);
  local_160 = vertex<agge::stroke>(&s);
  local_154 = vertex<agge::stroke>(&s);
  local_148 = vertex<agge::stroke>(&s);
  local_13c = vertex<agge::stroke>(&s);
  local_130 = vertex<agge::stroke>(&s);
  local_124 = vertex<agge::stroke>(&s);
  local_1d8._0_8_ = (pointer)0x40a000003fc00000;
  local_1d8._8_4_ = 1;
  local_1d8._12_4_ = 1.0;
  local_1d8._16_4_ = 2.0;
  local_1d8._24_8_ = 0x40c0000040800000;
  local_1b4.x = 1.5;
  local_1b4.y = 5.0;
  local_1a8.x = 4.0;
  local_1a8.y = 6.0;
  local_19c.x = 1.0;
  local_19c.y = 2.0;
  local_190.x = 0.0;
  local_190.y = 0.0;
  local_190.command = 0x30;
  local_184.x = 0.0;
  local_184.y = 0.0;
  local_184.command = 0;
  local_1d8._20_4_ = iVar2;
  local_1b8 = iVar2;
  local_1b4.command = iVar2;
  local_1a8.command = iVar2;
  local_19c.command = iVar2;
  std::__cxx11::string::string
            ((string *)&local_58,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/StrokeTests.cpp"
             ,&local_231);
  ut::LocationInfo::LocationInfo(&local_38,&local_58,0x106);
  ut::are_equal<agge::tests::mocks::path::point,agge::tests::mocks::path::point,8ul>
            ((point (*) [8])local_1d8,(point (*) [8])local_178,&local_38);
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  stroke::~stroke(&s);
  return;
}

Assistant:

test( StrokerGeneratesSinglePointSequenceForOpenSegment )
			{
				// INIT
				stroke s;

				move_to(s, 0.0f, 0.0f);
				line_to(s, 0.0f, 1.0f);

				s.set_cap(passthrough_cap(amount_alive));
				s.set_join(passthrough_join(amount_alive));
				s.width(4.0f);

				// ACT
				mocks::path::point points1[] = { vertex(s), vertex(s), vertex(s), vertex(s), vertex(s), vertex(s), vertex(s), vertex(s), };

				// ASSERT
				mocks::path::point reference1[] = {
					moveto(2.0f, 1.0f), lineto(0.0f, 0.0f), lineto(0.0f, 1.0f),
					lineto(2.0f, 1.0f), lineto(0.0f, 1.0f), lineto(0.0f, 0.0f),
					{ 0.0f, 0.0f, path_command_end_poly | path_flag_close },
					{ 0.0f, 0.0f, path_command_stop },
				};

				assert_equal(reference1, points1);

				// INIT
				s.remove_all();
				s.width(3.0f);
				move_to(s, 1.0f, 2.0f);
				line_to(s, 4.0f, 6.0f);

				// ACT
				mocks::path::point points2[] = { vertex(s), vertex(s), vertex(s), vertex(s), vertex(s), vertex(s), vertex(s), vertex(s), };

				// ASSERT
				mocks::path::point reference2[] = {
					moveto(1.5f, 5.0f), lineto(1.0f, 2.0f), lineto(4.0f, 6.0f),
					lineto(1.5f, 5.0f), lineto(4.0f, 6.0f), lineto(1.0f, 2.0f),
					{ 0.0f, 0.0f, path_command_end_poly | path_flag_close },
					{ 0.0f, 0.0f, path_command_stop },
				};

				assert_equal(reference2, points2);
			}